

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_Semaphore.h
# Opt level: O1

__sighandler_t __thiscall
axl::sys::NamedSemaphore::signal(NamedSemaphore *this,int __sig,__sighandler_t __handler)

{
  int iVar1;
  undefined8 unaff_RBX;
  ulong uVar2;
  undefined4 in_register_00000034;
  long lVar3;
  bool bVar4;
  
  bVar4 = CONCAT44(in_register_00000034,__sig) == 0;
  uVar2 = CONCAT71((int7)((ulong)unaff_RBX >> 8),bVar4);
  if (!bVar4) {
    lVar3 = CONCAT44(in_register_00000034,__sig);
    do {
      iVar1 = sem_post((sem_t *)(this->m_sem).
                                super_Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_>
                                .m_h);
      if (iVar1 != 0) {
        err::setLastSystemError();
        break;
      }
      lVar3 = lVar3 + -1;
      uVar2 = CONCAT71((int7)(uVar2 >> 8),lVar3 == 0);
    } while (lVar3 != 0);
  }
  return (__sighandler_t)(uVar2 & 0xffffffff);
}

Assistant:

bool
	signal(size_t count) {
		for (; count; count--) {
			bool result = m_sem.post();
			if (!result)
				return false;
		}

		return true;
	}